

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int arkStep_NlsFPFunction_MassIdent(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_NlsFPFunction_MassIdent",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_20->zpred,1.0,zcor,local_18->ycur);
    iVar2 = (*local_20->nls_fi)(local_18->tcur,local_18->ycur,local_20->Fi[local_20->istage],
                                local_18->user_data);
    local_20->nfi = local_20->nfi + 1;
    if (iVar2 < 0) {
      iVar1 = -8;
    }
    else {
      iVar1 = 9;
      if (iVar2 == 0) {
        N_VLinearSum(local_20->gamma,local_20->Fi[local_20->istage],1.0,local_20->sdata,g);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsFPFunction_MassIdent(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsFPFunction_MassIdent",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS and save for later */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* combine parts:  g = gamma*Fi(z) + sdata */
  N_VLinearSum(step_mem->gamma, step_mem->Fi[step_mem->istage],
               ONE, step_mem->sdata, g);

  return(ARK_SUCCESS);
}